

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTcSymMetaclassBase::add_prop
          (CTcSymMetaclassBase *this,char *txt,size_t len,char *obj_fname,int is_static)

{
  tc_symtype_t tVar1;
  CTcPrsSymtab *pCVar2;
  long in_RCX;
  ulong in_RDX;
  CTcSymMetaclassBase *in_RSI;
  CTcSymProp *prop_sym;
  textchar_t *in_stack_ffffffffffffff78;
  CTcTokenizer *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  CTcSymProp *in_stack_ffffffffffffff98;
  CTcSymMetaclassBase *in_stack_ffffffffffffffa0;
  CTcSymProp *local_30;
  
  CTcParser::get_global_symtab(G_prs);
  local_30 = (CTcSymProp *)
             CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                0x2af8c1);
  if (local_30 == (CTcSymProp *)0x0) {
    local_30 = (CTcSymProp *)CTcSymbolBase::operator_new(0x2af961);
    CTcGenTarg::new_prop_id(G_cg);
    CTcSymProp::CTcSymProp
              ((CTcSymProp *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (tctarg_prop_id_t)((ulong)in_stack_ffffffffffffff78 >> 0x10));
    in_stack_ffffffffffffff98 = local_30;
    pCVar2 = CTcParser::get_global_symtab(G_prs);
    (*pCVar2->_vptr_CTcPrsSymtab[3])(pCVar2,local_30);
    in_stack_ffffffffffffffa0 = in_RSI;
  }
  else {
    tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)local_30);
    if (tVar1 != TC_SYM_PROP) {
      if (in_RCX == 0) {
        CTcTokenizer::log_error_curtok
                  (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      }
      else {
        CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e1c,in_RDX & 0xffffffff,
                           in_RSI,"property",in_RCX);
      }
      local_30 = (CTcSymProp *)0x0;
    }
  }
  if (local_30 != (CTcSymProp *)0x0) {
    (*((CVmHashEntry *)&(local_30->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->
      _vptr_CVmHashEntry[0xf])();
    add_prop(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  }
  return;
}

Assistant:

void CTcSymMetaclassBase::add_prop(
    const char *txt, size_t len, const char *obj_fname, int is_static)
{
    /* see if this property is already defined */
    CTcSymProp *prop_sym =
        (CTcSymProp *)G_prs->get_global_symtab()->find(txt, len);
    if (prop_sym != 0)
    {
        /* it's already defined - make sure it's a property */
        if (prop_sym->get_type() != TC_SYM_PROP)
        {
            /* 
             *   it's something other than a property - log the
             *   appropriate type of error, depending on whether we're
             *   loading this from an object file or from source code 
             */
            if (obj_fname == 0)
            {
                /* creating from source - note the code location */
                G_tok->log_error_curtok(TCERR_REDEF_AS_PROP);
            }
            else
            {
                /* loading from an object file */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_OBJFILE_REDEF_SYM_TYPE,
                                    (int)len, txt, "property", obj_fname);
            }

            /* forget the symbol - it's not a property */
            prop_sym = 0;
        }
    }
    else
    {
        /* add the property definition */
        prop_sym = new CTcSymProp(txt, len, FALSE, G_cg->new_prop_id());
        G_prs->get_global_symtab()->add_entry(prop_sym);
    }

    /* 
     *   if we found a valid property symbol, add it to the metaclass
     *   property list 
     */
    if (prop_sym != 0)
    {
        /* 
         *   mark the symbol as referenced - even if we don't directly
         *   make use of it, the metaclass table references this symbol 
         */
        prop_sym->mark_referenced();
        
        /* add the property to the metaclass list */
        add_prop(prop_sym, is_static);
    }
}